

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_sqlite3.c
# Opt level: O0

uint8_t mm_sql_read_uint8(void *db,char *sql)

{
  FILE *__stream;
  sqlite3_stmt *psVar1;
  int iVar2;
  char *pcVar3;
  int rc;
  uint8_t val;
  sqlite3_stmt *res;
  char *sql_local;
  void *db_local;
  
  _rc = (sqlite3_stmt *)0x0;
  res = (sqlite3_stmt *)sql;
  sql_local = (char *)db;
  iVar2 = sqlite3_prepare_v2((sqlite3 *)db,sql,-1,(sqlite3_stmt **)&rc,(char **)0x0);
  psVar1 = res;
  __stream = _stderr;
  if (iVar2 == 0) {
    sqlite3_step(_rc);
    iVar2 = sqlite3_column_int(_rc,0);
    sqlite3_finalize(_rc);
    db_local._7_1_ = (uint8_t)iVar2;
  }
  else {
    pcVar3 = sqlite3_errmsg((sqlite3 *)sql_local);
    fprintf(__stream,"%s: Failed to prepare: \nSQL: \'%s\'\nError: %s","mm_sql_read_uint8",psVar1,
            pcVar3);
    db_local._7_1_ = 0xff;
  }
  return db_local._7_1_;
}

Assistant:

uint8_t mm_sql_read_uint8(void* db, const char* sql) {
    sqlite3_stmt* res = NULL;
    uint8_t val = 0;
    int rc = sqlite3_prepare_v2((sqlite3*)db, sql, -1, &res, 0);

    if (rc != SQLITE_OK) {
        fprintf(stderr, "%s: Failed to prepare: \nSQL: '%s'\nError: %s", __func__, sql, sqlite3_errmsg((sqlite3*)(db)));
        return 0xFF;
    }

    sqlite3_step(res);

    val = (uint8_t)sqlite3_column_int(res, 0);

    sqlite3_finalize(res);

    return (val);
}